

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.h
# Opt level: O0

void __thiscall Assimp::IRRImporter::Animator::Animator(Animator *this,AT t)

{
  AT t_local;
  Animator *this_local;
  
  this->type = t;
  this->speed = 0.001;
  aiVector3t<float>::aiVector3t(&this->direction,0.0,1.0,0.0);
  aiVector3t<float>::aiVector3t(&this->circleCenter);
  this->circleRadius = 1.0;
  this->tightness = 0.5;
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->splineKeys);
  this->loop = true;
  this->timeForWay = 100;
  return;
}

Assistant:

explicit Animator(AT t = UNKNOWN)
            : type              (t)
            , speed             ( ai_real( 0.001 ) )
            , direction         ( ai_real( 0.0 ), ai_real( 1.0 ), ai_real( 0.0 ) )
            , circleRadius      ( ai_real( 1.0) )
            , tightness         ( ai_real( 0.5 ) )
            , loop              (true)
            , timeForWay        (100)
        {
        }